

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite_inl.h
# Opt level: O1

bool google::protobuf::internal::WireFormatLite::
     ReadPackedPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)5>
               (CodedInputStream *input,RepeatedField<int> *values)

{
  byte bVar1;
  uint8 *puVar2;
  byte *pbVar3;
  ulong uVar4;
  Limit limit;
  uint32 first_byte_or_zero;
  ulong uVar5;
  int iVar6;
  int value;
  ulong unaff_R15;
  bool bVar7;
  
  puVar2 = input->buffer_;
  if ((puVar2 < input->buffer_end_) && (iVar6 = (int)(char)*puVar2, -1 < (char)*puVar2)) {
    input->buffer_ = puVar2 + 1;
    bVar7 = true;
  }
  else {
    iVar6 = io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
    bVar7 = -1 < iVar6;
  }
  if (bVar7) {
    limit = io::CodedInputStream::PushLimit(input,iVar6);
    iVar6 = io::CodedInputStream::BytesUntilLimit(input);
    while (0 < iVar6) {
      pbVar3 = input->buffer_;
      if (pbVar3 < input->buffer_end_) {
        bVar1 = *pbVar3;
        uVar5 = (ulong)bVar1;
        first_byte_or_zero = (uint32)bVar1;
        if ((char)bVar1 < '\0') goto LAB_0030b6f0;
        input->buffer_ = pbVar3 + 1;
        bVar7 = true;
      }
      else {
        first_byte_or_zero = 0;
LAB_0030b6f0:
        uVar5 = io::CodedInputStream::ReadVarint32Fallback(input,first_byte_or_zero);
        bVar7 = -1 < (long)uVar5;
      }
      uVar4 = unaff_R15;
      if (bVar7) {
        uVar4 = uVar5;
      }
      unaff_R15 = uVar4 & 0xffffffff;
      if (!bVar7) goto LAB_0030b747;
      if (values->current_size_ == values->total_size_) {
        RepeatedField<int>::Reserve(values,values->total_size_ + 1);
      }
      iVar6 = values->current_size_;
      values->current_size_ = iVar6 + 1;
      values->rep_->elements[iVar6] = (int)uVar4;
      iVar6 = io::CodedInputStream::BytesUntilLimit(input);
    }
    io::CodedInputStream::PopLimit(input,limit);
    bVar7 = true;
  }
  else {
LAB_0030b747:
    bVar7 = false;
  }
  return bVar7;
}

Assistant:

inline bool WireFormatLite::ReadPackedPrimitive(io::CodedInputStream* input,
                                                RepeatedField<CType>* values) {
  int length;
  if (!input->ReadVarintSizeAsInt(&length)) return false;
  io::CodedInputStream::Limit limit = input->PushLimit(length);
  while (input->BytesUntilLimit() > 0) {
    CType value;
    if (!ReadPrimitive<CType, DeclaredType>(input, &value)) return false;
    values->Add(value);
  }
  input->PopLimit(limit);
  return true;
}